

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.cpp
# Opt level: O0

int __thiscall CSound::Init(CSound *this)

{
  int iVar1;
  IConfigManager *pIVar2;
  undefined4 extraout_var;
  IEngineGraphics *pIVar3;
  IStorage *pIVar4;
  undefined8 uVar5;
  IInterface *in_RDI;
  long in_FS_OFFSET;
  int i;
  SDL_AudioSpec Format;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_3c;
  int local_2c;
  undefined4 local_28;
  undefined2 local_24;
  undefined1 local_22;
  undefined2 local_20;
  code *local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_3c = 0; local_3c < 0x10; local_3c = local_3c + 1) {
    m_aChannels[local_3c].m_Vol = 0xff;
  }
  *(undefined4 *)&in_RDI[1]._vptr_IInterface = 0;
  IInterface::Kernel(in_RDI);
  pIVar2 = IKernel::RequestInterface<IConfigManager>
                     ((IKernel *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  iVar1 = (*(pIVar2->super_IInterface)._vptr_IInterface[6])();
  in_RDI[1].m_pKernel = (IKernel *)CONCAT44(extraout_var,iVar1);
  IInterface::Kernel(in_RDI);
  pIVar3 = IKernel::RequestInterface<IEngineGraphics>
                     ((IKernel *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  in_RDI[2]._vptr_IInterface = (_func_int **)pIVar3;
  IInterface::Kernel(in_RDI);
  pIVar4 = IKernel::RequestInterface<IStorage>
                     ((IKernel *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  in_RDI[2].m_pKernel = (IKernel *)pIVar4;
  m_SoundLock = lock_create();
  if (*(int *)((long)&in_RDI[1].m_pKernel[0x1d0]._vptr_IKernel + 4) == 0) {
    local_2c = 0;
  }
  else {
    iVar1 = SDL_InitSubSystem(0x10);
    if (iVar1 < 0) {
      uVar5 = SDL_GetError();
      dbg_msg("gfx","unable to init SDL audio: %s",uVar5);
      local_2c = -1;
    }
    else {
      m_MixingRate = *(int *)((long)&in_RDI[1].m_pKernel[0x1cf]._vptr_IKernel + 4);
      local_28 = *(undefined4 *)((long)&in_RDI[1].m_pKernel[0x1cf]._vptr_IKernel + 4);
      local_24 = 0x8010;
      local_22 = 2;
      local_20 = (undefined2)*(undefined4 *)&in_RDI[1].m_pKernel[0x1cf]._vptr_IKernel;
      local_18 = SdlCallback;
      local_10 = 0;
      iVar1 = SDL_OpenAudio(&local_28,0);
      if (iVar1 < 0) {
        uVar5 = SDL_GetError();
        dbg_msg("client/sound","unable to open audio: %s",uVar5);
        local_2c = -1;
      }
      else {
        dbg_msg("client/sound","sound init successful");
        m_MaxFrames = *(int *)&in_RDI[1].m_pKernel[0x1cf]._vptr_IKernel << 1;
        m_pMixBuffer = (int *)mem_alloc(0);
        SDL_PauseAudio(0);
        *(undefined4 *)&in_RDI[1]._vptr_IInterface = 1;
        (*in_RDI->_vptr_IInterface[0xd])();
        local_2c = 0;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_2c;
  }
  __stack_chk_fail();
}

Assistant:

int CSound::Init()
{
	for(int i = 0; i < NUM_CHANNELS; ++i)
		m_aChannels[i].m_Vol = 255;

	m_SoundEnabled = 0;
	m_pConfig = Kernel()->RequestInterface<IConfigManager>()->Values();
	m_pGraphics = Kernel()->RequestInterface<IEngineGraphics>();
	m_pStorage = Kernel()->RequestInterface<IStorage>();

	SDL_AudioSpec Format;

	m_SoundLock = lock_create();

	if(!m_pConfig->m_SndInit)
		return 0;

	if(SDL_InitSubSystem(SDL_INIT_AUDIO) < 0)
	{
		dbg_msg("gfx", "unable to init SDL audio: %s", SDL_GetError());
		return -1;
	}

	m_MixingRate = m_pConfig->m_SndRate;

	// Set 16-bit stereo audio at 22Khz
	Format.freq = m_pConfig->m_SndRate; // ignore_convention
	Format.format = AUDIO_S16; // ignore_convention
	Format.channels = 2; // ignore_convention
	Format.samples = m_pConfig->m_SndBufferSize; // ignore_convention
	Format.callback = SdlCallback; // ignore_convention
	Format.userdata = NULL; // ignore_convention

	// Open the audio device and start playing sound!
	if(SDL_OpenAudio(&Format, NULL) < 0)
	{
		dbg_msg("client/sound", "unable to open audio: %s", SDL_GetError());
		return -1;
	}
	else
		dbg_msg("client/sound", "sound init successful");

	m_MaxFrames = m_pConfig->m_SndBufferSize*2;
	m_pMixBuffer = (int *)mem_alloc(m_MaxFrames*2*sizeof(int));

	SDL_PauseAudio(0);

	m_SoundEnabled = 1;
	Update(); // update the volume
	return 0;
}